

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O1

CallIndirect * __thiscall
wasm::Builder::makeCallIndirect<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
          (Builder *this,Name table,Expression *target,
          vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *args,HeapType heapType,
          bool isReturn)

{
  bool bVar1;
  CallIndirect *this_00;
  MixedArena *this_01;
  Signature SVar2;
  HeapType local_48;
  HeapType heapType_local;
  
  local_48.id = heapType.id;
  heapType_local.id = (uintptr_t)args;
  bVar1 = HeapType::isSignature(&local_48);
  if (bVar1) {
    this_01 = &this->wasm->allocator;
    this_00 = (CallIndirect *)MixedArena::allocSpace(this_01,0x58,8);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression._id =
         CallIndirectId;
    (this_00->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id = 0;
    (this_00->heapType).id = 1;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    data = (Expression **)0x0;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    usedElements = 0;
    (this_00->operands).super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
    allocatedElements = 0;
    (this_00->operands).allocator = this_01;
    (this_00->table).super_IString.str._M_len = 0;
    (this_00->table).super_IString.str._M_str = (char *)0x0;
    this_00->isReturn = false;
    (this_00->table).super_IString.str._M_len = table.super_IString.str._M_len;
    (this_00->table).super_IString.str._M_str = table.super_IString.str._M_str;
    (this_00->heapType).id = local_48.id;
    SVar2 = HeapType::getSignature(&local_48);
    (this_00->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id =
         SVar2.results.id.id;
    this_00->target = target;
    ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*>::
    set<std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>>
              ((ArenaVectorBase<ArenaVector<wasm::Expression*>,wasm::Expression*> *)
               &this_00->operands,
               (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)heapType_local.id)
    ;
    this_00->isReturn = isReturn;
    CallIndirect::finalize(this_00);
    return this_00;
  }
  __assert_fail("heapType.isSignature()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-builder.h"
                ,0x138,
                "CallIndirect *wasm::Builder::makeCallIndirect(const Name, Expression *, const T &, HeapType, bool) [T = std::vector<wasm::Expression *>]"
               );
}

Assistant:

CallIndirect* makeCallIndirect(const Name table,
                                 Expression* target,
                                 const T& args,
                                 HeapType heapType,
                                 bool isReturn = false) {
    assert(heapType.isSignature());
    auto* call = wasm.allocator.alloc<CallIndirect>();
    call->table = table;
    call->heapType = heapType;
    call->type = heapType.getSignature().results;
    call->target = target;
    call->operands.set(args);
    call->isReturn = isReturn;
    call->finalize();
    return call;
  }